

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_encoder_isac_t_impl.h
# Opt level: O2

Config * webrtc::CreateIsacConfig<webrtc::IsacFloat>
                   (Config *__return_storage_ptr__,CodecInst *codec_inst,
                   scoped_refptr<webrtc::LockedIsacBandwidthInfo> *bwinfo)

{
  int iVar1;
  
  AudioEncoderIsacT<webrtc::IsacFloat>::Config::Config(__return_storage_ptr__);
  rtc::scoped_refptr<webrtc::LockedIsacBandwidthInfo>::operator=
            (&__return_storage_ptr__->bwinfo,bwinfo);
  __return_storage_ptr__->payload_type = codec_inst->pltype;
  iVar1 = codec_inst->plfreq;
  __return_storage_ptr__->sample_rate_hz = iVar1;
  iVar1 = rtc::CheckedDivExact<int>(codec_inst->pacsize * 1000,iVar1);
  __return_storage_ptr__->frame_size_ms = iVar1;
  iVar1 = codec_inst->rate;
  __return_storage_ptr__->adaptive_mode = iVar1 == -1;
  if (iVar1 != -1) {
    __return_storage_ptr__->bit_rate = iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

typename AudioEncoderIsacT<T>::Config CreateIsacConfig(
    const CodecInst& codec_inst,
    const rtc::scoped_refptr<LockedIsacBandwidthInfo>& bwinfo) {
  typename AudioEncoderIsacT<T>::Config config;
  config.bwinfo = bwinfo;
  config.payload_type = codec_inst.pltype;
  config.sample_rate_hz = codec_inst.plfreq;
  config.frame_size_ms =
      rtc::CheckedDivExact(1000 * codec_inst.pacsize, config.sample_rate_hz);
  config.adaptive_mode = (codec_inst.rate == -1);
  if (codec_inst.rate != -1)
    config.bit_rate = codec_inst.rate;
  return config;
}